

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-value.c
# Opt level: O1

void test_array_remove(void)

{
  uint uVar1;
  VALUE *pVVar2;
  size_t sVar3;
  int i32;
  VALUE a;
  VALUE local_40;
  
  value_init_array(&local_40);
  i32 = 0;
  do {
    pVVar2 = value_array_append(&local_40);
    value_init_int32(pVVar2,i32);
    i32 = i32 + 1;
  } while (i32 != 100000);
  value_array_remove_range(&local_40,10000,20000);
  sVar3 = value_array_size(&local_40);
  acutest_check_((uint)(sVar3 == 80000),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x2ed,"%s","value_array_size(&a) == N - (N / 5)");
  sVar3 = 0;
  do {
    pVVar2 = value_array_get(&local_40,sVar3);
    uVar1 = value_int32(pVVar2);
    acutest_check_((uint)(sVar3 == uVar1),
                   "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                   ,0x2f1,"%s","value_int32(v) == i");
    sVar3 = sVar3 + 1;
  } while (sVar3 != 10000);
  sVar3 = 10000;
  do {
    pVVar2 = value_array_get(&local_40,sVar3);
    uVar1 = value_int32(pVVar2);
    acutest_check_((uint)(sVar3 + 20000 == (ulong)uVar1),
                   "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                   ,0x2f6,"%s","value_int32(v) == i + N / 5");
    sVar3 = sVar3 + 1;
  } while (sVar3 != 79999);
  value_fini(&local_40);
  return;
}

Assistant:

static void
test_array_remove(void)
{
    const int N = 100000;

    VALUE a;
    VALUE* v;
    int i;

    value_init_array(&a);
    for(i = 0; i < N; i++) {
        v = value_array_append(&a);
        value_init_int32(v, i);
    }

    value_array_remove_range(&a, N / 10, N / 5);
    TEST_CHECK(value_array_size(&a) == N - (N / 5));

    for(i = 0; i < N / 10; i++) {
        v = value_array_get(&a, i);
        TEST_CHECK(value_int32(v) == i);
    }

    for(i = N / 10; i < N - (N / 5) - 1; i++) {
        v = value_array_get(&a, i);
        TEST_CHECK(value_int32(v) == i + N / 5);
    }

    value_fini(&a);
}